

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall ON_SubDVertex::HasInteriorVertexTopology(ON_SubDVertex *this)

{
  ushort uVar1;
  ON_SubDEdgePtr *pOVar2;
  ushort uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar1 = this->m_edge_count;
  bVar5 = false;
  if ((1 < uVar1) && (bVar5 = false, uVar1 == this->m_face_count)) {
    pOVar2 = this->m_edges;
    bVar5 = false;
    if ((pOVar2 != (ON_SubDEdgePtr *)0x0) && (this->m_faces != (ON_SubDFace **)0x0)) {
      uVar4 = pOVar2->m_ptr & 0xfffffffffffffff8;
      if (uVar4 == 0) {
        bVar5 = false;
      }
      else {
        uVar3 = 1;
        bVar5 = false;
        do {
          if (*(short *)(uVar4 + 100) != 2) {
            return bVar5;
          }
          bVar5 = uVar1 <= uVar3;
          if (uVar3 == uVar1) {
            return bVar5;
          }
          uVar4 = (ulong)uVar3;
          uVar3 = uVar3 + 1;
          uVar4 = pOVar2[uVar4].m_ptr & 0xfffffffffffffff8;
        } while (uVar4 != 0);
      }
    }
  }
  return bVar5;
}

Assistant:

bool ON_SubDVertex::HasInteriorVertexTopology() const
{
  if (m_edge_count >= 2 && m_edge_count == m_face_count && nullptr != m_edges && nullptr != m_faces)
  {
    for (unsigned short vei = 0; vei < m_edge_count; ++vei)
    {
      const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
      if (nullptr == e || 2 != e->m_face_count)
        return false;
    }
    return true;
  }    
  return false;
}